

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitArrayInit(FunctionValidator *this,ArrayInit *curr)

{
  Type left;
  bool bVar1;
  DataSegment *pDVar2;
  ElementSegment *pEVar3;
  Type local_48;
  int local_3c;
  Type local_38;
  HeapType local_30;
  HeapType heapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.init_* requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this->info,(Type)(curr->index->type).id,(Type)0x2,curr,
             "array.init_* index must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this->info,(Type)(curr->offset->type).id,(Type)0x2,curr,
             "array.init_* offset must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this->info,(Type)(curr->size->type).id,(Type)0x2,curr,
             "array.init_* size must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.type.id != 1) {
    left.id = (curr->ref->type).id;
    wasm::Type::Type(&local_38,(HeapType)0x6,Nullable);
    bVar1 = shouldBeSubType(this,left,local_38,(Expression *)curr,
                            "array.init_* destination must be an array reference");
    if (bVar1) {
      local_30 = wasm::Type::getHeapType(&curr->ref->type);
      if (local_30.id != 0xb) {
        bVar1 = HeapType::isArray(&local_30);
        bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
                          (this->info,bVar1,curr,
                           "array.init_* destination must be an array reference",
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .currFunction);
        if (bVar1) {
          HeapType::getArray((HeapType *)&local_48);
          ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
                    (this->info,local_3c != 0,curr,"array.init_* destination must be mutable",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
          if (curr->op == InitElem) {
            pEVar3 = Module::getElementSegmentOrNull
                               ((this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currModule,(Name)(curr->segment).super_IString.str);
            bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
                              (this->info,pEVar3 != (ElementSegment *)0x0,curr,
                               "array.init_elem segment must exist",
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                               ).
                               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .
                               super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                               .currFunction);
            if (bVar1) {
              shouldBeSubType(this,(Type)(pEVar3->type).id,local_48,(Expression *)curr,
                              "array.init_elem segment type must match destination type");
            }
          }
          else {
            if (curr->op != InitData) {
              __assert_fail("curr->op == InitElem",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                            ,0xbba,"void wasm::FunctionValidator::visitArrayInit(ArrayInit *)");
            }
            pDVar2 = Module::getDataSegmentOrNull
                               ((this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currModule,(Name)(curr->segment).super_IString.str);
            ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
                      (this->info,pDVar2 != (DataSegment *)0x0,curr,
                       "array.init_data segment must exist",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
            ValidationInfo::shouldBeTrue<wasm::ArrayInit*>
                      (this->info,local_48.id - 2 < 5,curr,
                       "array.init_data destination must be numeric",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayInit(ArrayInit* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.init_* requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(curr->index->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* index must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->offset->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->size->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.init_* destination must be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none ||
      !shouldBeTrue(heapType.isArray(),
                    curr,
                    "array.init_* destination must be an array reference")) {
    return;
  }
  auto element = heapType.getArray().element;
  shouldBeTrue(
    element.mutable_, curr, "array.init_* destination must be mutable");
  if (curr->op == InitData) {
    shouldBeTrue(getModule()->getDataSegmentOrNull(curr->segment),
                 curr,
                 "array.init_data segment must exist");
    shouldBeTrue(element.type.isNumber(),
                 curr,
                 "array.init_data destination must be numeric");
  } else {
    assert(curr->op == InitElem);
    auto* seg = getModule()->getElementSegmentOrNull(curr->segment);
    if (!shouldBeTrue(seg, curr, "array.init_elem segment must exist")) {
      return;
    }
    shouldBeSubType(seg->type,
                    element.type,
                    curr,
                    "array.init_elem segment type must match destination type");
  }
}